

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::SetRepartitionRadixBits
          (JoinHashTable *this,idx_t max_ht_size,idx_t max_partition_size,idx_t max_partition_count)

{
  idx_t iVar1;
  BufferManager *buffer_manager;
  pointer pLVar2;
  pointer pLVar3;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var4;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  TupleDataLayout *pTVar8;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> this_00;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  shared_ptr<duckdb::TupleDataLayout,_true> local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  iVar1 = this->radix_bits;
  lVar9 = 1;
  if (1 < 0xc - iVar1) {
    auVar10._8_4_ = (int)(max_partition_size >> 0x20);
    auVar10._0_8_ = max_partition_size;
    auVar10._12_4_ = 0x45300000;
    dStack_40 = auVar10._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 +
               ((double)CONCAT44(0x43300000,(int)max_partition_size) - 4503599627370496.0);
    auVar11._8_4_ = (int)(max_partition_count >> 0x20);
    auVar11._0_8_ = max_partition_count;
    auVar11._12_4_ = 0x45300000;
    dStack_60 = auVar11._8_8_ - 1.9342813113834067e+25;
    auVar15._8_4_ = (int)(max_ht_size >> 0x20);
    auVar15._0_8_ = max_ht_size;
    auVar15._12_4_ = 0x45300000;
    dStack_50 = auVar15._8_8_ - 1.9342813113834067e+25;
    local_58 = (dStack_50 + ((double)CONCAT44(0x43300000,(int)max_ht_size) - 4503599627370496.0)) *
               0.25;
    local_68 = dStack_60 +
               ((double)CONCAT44(0x43300000,(int)max_partition_count) - 4503599627370496.0);
    do {
      lVar5 = 1L << ((byte)lVar9 & 0x3f);
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = 0x45300000;
      dStack_30 = auVar12._8_8_ - 1.9342813113834067e+25;
      local_38 = dStack_30 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      uVar6 = (ulong)(local_68 / local_38);
      uVar6 = (long)(local_68 / local_38 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
      auVar13._8_4_ = (int)(uVar6 >> 0x20);
      auVar13._0_8_ = uVar6;
      auVar13._12_4_ = 0x45300000;
      dVar14 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * this->load_factor;
      uVar6 = (ulong)dVar14;
      uVar7 = NextPowerOfTwo((long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
      if (uVar7 < 0x4001) {
        uVar7 = 0x4000;
      }
      lVar5 = uVar7 << 3;
      auVar16._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar16._0_8_ = lVar5;
      auVar16._12_4_ = 0x45300000;
    } while ((local_58 <
              (auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) + local_48 / local_38)
            && (lVar5 = iVar1 + lVar9, lVar9 = lVar9 + 1, lVar5 != 0xb));
  }
  this->radix_bits = this->radix_bits + lVar9;
  buffer_manager = this->buffer_manager;
  pTVar8 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&this->layout_ptr);
  pLVar2 = (pTVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar3 = (pTVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00._M_head_impl = (PartitionedTupleData *)operator_new(0x90);
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->layout_ptr).internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->layout_ptr).internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  RadixPartitionedTupleData::RadixPartitionedTupleData
            ((RadixPartitionedTupleData *)this_00._M_head_impl,buffer_manager,&local_78,
             this->radix_bits,((long)pLVar2 - (long)pLVar3 >> 3) * -0x5555555555555555 - 1);
  if (local_78.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.internal.
               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  _Var4._M_head_impl =
       (this->sink_collection).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  (this->sink_collection).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var4._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_PartitionedTupleData + 8))();
  }
  InitializePartitionMasks(this);
  return;
}

Assistant:

void JoinHashTable::SetRepartitionRadixBits(const idx_t max_ht_size, const idx_t max_partition_size,
                                            const idx_t max_partition_count) {
	D_ASSERT(max_partition_size + PointerTableSize(max_partition_count) > max_ht_size);

	const auto max_added_bits = RadixPartitioning::MAX_RADIX_BITS - radix_bits;
	idx_t added_bits = 1;
	for (; added_bits < max_added_bits; added_bits++) {
		double partition_multiplier = static_cast<double>(RadixPartitioning::NumberOfPartitions(added_bits));

		auto new_estimated_size = static_cast<double>(max_partition_size) / partition_multiplier;
		auto new_estimated_count = static_cast<double>(max_partition_count) / partition_multiplier;
		auto new_estimated_ht_size =
		    new_estimated_size + static_cast<double>(PointerTableSize(LossyNumericCast<idx_t>(new_estimated_count)));

		if (new_estimated_ht_size <= static_cast<double>(max_ht_size) / 4) {
			// Aim for an estimated partition size of max_ht_size / 4
			break;
		}
	}
	radix_bits += added_bits;
	sink_collection =
	    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, radix_bits, layout_ptr->ColumnCount() - 1);

	// Need to initialize again after changing the number of bits
	InitializePartitionMasks();
}